

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

FMStructDescList combineCpDpFormats(FMStructDescList top,FMStructDescList cp,FMStructDescList dp)

{
  void *__ptr;
  FMStructDescList repl;
  char *pcVar1;
  FMFieldList p_Var2;
  int iVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  FMStructDescList CombinedFormats;
  int dpCount;
  int cpCount;
  int topCount;
  int i;
  uint3 uVar4;
  uint in_stack_ffffffffffffffcc;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint repl_size;
  
  iVar7 = 0;
  iVar6 = 0;
  iVar5 = 0;
  __ptr = (void *)FMcopy_struct_list(in_RDI);
  iVar8 = 0;
  while (*(long *)(in_RDI + (long)iVar8 * 0x20) != 0) {
    iVar7 = iVar7 + 1;
    iVar8 = iVar8 + 1;
  }
  iVar8 = 0;
  while( true ) {
    repl_size = in_stack_ffffffffffffffcc & 0xffffff;
    iVar3 = iVar8;
    if (in_RSI != 0) {
      iVar3 = iVar8 + 1;
      repl_size = CONCAT13(*(long *)(in_RSI + (long)iVar8 * 0x20) != 0,
                           (int3)in_stack_ffffffffffffffcc);
    }
    if ((char)(repl_size >> 0x18) == '\0') break;
    iVar6 = iVar6 + 1;
    in_stack_ffffffffffffffcc = repl_size;
    iVar8 = iVar3;
  }
  iVar8 = 0;
  while( true ) {
    uVar4 = (uint3)(ushort)repl_size;
    iVar3 = iVar8;
    if (in_RDX != 0) {
      iVar3 = iVar8 + 1;
      uVar4 = CONCAT12(*(long *)(in_RDX + (long)iVar8 * 0x20) != 0,(ushort)repl_size);
    }
    repl_size = CONCAT13((char)(repl_size >> 0x18),uVar4);
    if ((char)(uVar4 >> 0x10) == '\0') break;
    iVar5 = iVar5 + 1;
    iVar8 = iVar3;
  }
  repl = (FMStructDescList)realloc(__ptr,(long)(iVar7 + iVar6 + iVar5 + 1) << 5);
  for (iVar8 = 0; iVar8 < iVar6; iVar8 = iVar8 + 1) {
    pcVar1 = strdup(*(char **)(in_RSI + (long)iVar8 * 0x20));
    repl[iVar7 + iVar8].format_name = pcVar1;
    p_Var2 = (FMFieldList)copy_field_list(*(undefined8 *)(in_RSI + (long)iVar8 * 0x20 + 8));
    repl[iVar7 + iVar8].field_list = p_Var2;
    repl[iVar7 + iVar8].struct_size = *(int *)(in_RSI + (long)iVar8 * 0x20 + 0x10);
    repl[iVar7 + iVar8].opt_info = (FMOptInfo *)0x0;
  }
  for (iVar8 = 0; iVar8 < iVar5; iVar8 = iVar8 + 1) {
    pcVar1 = strdup(*(char **)(in_RDX + (long)iVar8 * 0x20));
    repl[iVar7 + iVar6 + iVar8].format_name = pcVar1;
    p_Var2 = (FMFieldList)copy_field_list(*(undefined8 *)(in_RDX + (long)iVar8 * 0x20 + 8));
    repl[iVar7 + iVar6 + iVar8].field_list = p_Var2;
    repl[iVar7 + iVar6 + iVar8].struct_size = *(int *)(in_RDX + (long)iVar8 * 0x20 + 0x10);
    repl[iVar7 + iVar6 + iVar8].opt_info = (FMOptInfo *)0x0;
  }
  repl[iVar7 + iVar6 + iVar5].format_name = (char *)0x0;
  repl[iVar7 + iVar6 + iVar5].field_list = (FMFieldList)0x0;
  repl[iVar7 + iVar6 + iVar5].struct_size = 0;
  repl[iVar7 + iVar6 + iVar5].opt_info = (FMOptInfo *)0x0;
  replaceFormatNameInFieldList
            ((FMStructDescList)CONCAT44(iVar8,iVar7),(char *)CONCAT44(iVar6,iVar5),(char *)repl,
             repl_size);
  replaceFormatNameInFieldList
            ((FMStructDescList)CONCAT44(iVar8,iVar7),(char *)CONCAT44(iVar6,iVar5),(char *)repl,
             repl_size);
  return repl;
}

Assistant:

static FMStructDescList combineCpDpFormats(FMStructDescList top, FMStructDescList cp,
                                           FMStructDescList dp)
{
    int i = 0, topCount = 0, cpCount = 0, dpCount = 0;
    FMStructDescList CombinedFormats = FMcopy_struct_list(top);

    i = 0;
    while (top[i++].format_name)
        topCount++;

    i = 0;
    while (cp && cp[i++].format_name)
        cpCount++;

    i = 0;
    while (dp && dp[i++].format_name)
        dpCount++;

    CombinedFormats =
        realloc(CombinedFormats, sizeof(CombinedFormats[0]) * (topCount + cpCount + dpCount + 1));
    for (i = 0; i < cpCount; i++)
    {
        CombinedFormats[topCount + i].format_name = strdup(cp[i].format_name);
        CombinedFormats[topCount + i].field_list = copy_field_list(cp[i].field_list);
        CombinedFormats[topCount + i].struct_size = cp[i].struct_size;
        CombinedFormats[topCount + i].opt_info = NULL;
    }

    for (i = 0; i < dpCount; i++)
    {
        CombinedFormats[topCount + cpCount + i].format_name = strdup(dp[i].format_name);
        CombinedFormats[topCount + cpCount + i].field_list = copy_field_list(dp[i].field_list);
        CombinedFormats[topCount + cpCount + i].struct_size = dp[i].struct_size;
        CombinedFormats[topCount + cpCount + i].opt_info = NULL;
    }
    CombinedFormats[topCount + cpCount + dpCount].format_name = NULL;
    CombinedFormats[topCount + cpCount + dpCount].field_list = NULL;
    CombinedFormats[topCount + cpCount + dpCount].struct_size = 0;
    CombinedFormats[topCount + cpCount + dpCount].opt_info = NULL;

    replaceFormatNameInFieldList(CombinedFormats, "CP_STRUCT", cp ? cp[0].format_name : NULL,
                                 cp ? cp[0].struct_size : 0);
    replaceFormatNameInFieldList(CombinedFormats, "DP_STRUCT", dp ? dp[0].format_name : NULL,
                                 dp ? dp[0].struct_size : 0);
    return CombinedFormats;
}